

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

LONGLONG readlonglong(uchar *infile)

{
  uchar b [8];
  LONGLONG a;
  int i;
  char *in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  ulong local_18;
  int local_c;
  
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    qread((uchar *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),
          in_stack_ffffffffffffffd8,0);
  }
  local_18 = (ulong)in_stack_ffffffffffffffe0;
  for (local_c = 1; local_c < 8; local_c = local_c + 1) {
    local_18 = local_18 * 0x100 + (ulong)(byte)(&stack0xffffffffffffffe0)[local_c];
  }
  return local_18;
}

Assistant:

static LONGLONG readlonglong(unsigned char *infile)
{
int i;
LONGLONG a;
unsigned char b[8];

	/* Read integer A one byte at a time from infile.
	 *
	 * This is portable from Vax to Sun since it eliminates the
	 * need for byte-swapping.
	 *
         *  This routine is only called to read the first 3 values
	 *  in the compressed file, so it doesn't have to be 
	 *  super-efficient
	 */
	for (i=0; i<8; i++) qread(infile,(char *) &b[i],1);
	a = b[0];
	for (i=1; i<8; i++) a = (a<<8) + b[i];
	return(a);
}